

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O1

vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> * __thiscall
pbrt::ParameterDictionary::extractSpectrumArray
          (vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
           *__return_storage_ptr__,ParameterDictionary *this,ParsedParameter *param,
          SpectrumType spectrumType,Allocator alloc)

{
  double dVar1;
  ulong uVar2;
  size_type sVar3;
  Allocator alloc_00;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  memory_resource **ppmVar6;
  int iVar7;
  RGBSpectrum *this_00;
  ulong uVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  iterator iVar9;
  mapped_type *pmVar10;
  string *psVar11;
  double *pdVar12;
  RGBColorSpace *cs;
  size_type sVar13;
  ParameterDictionary *pPVar14;
  Float FVar15;
  char *fmt;
  long lVar16;
  long lVar17;
  size_t i;
  long lVar18;
  memory_resource *pmVar19;
  ulong uVar20;
  long lVar21;
  span<const_float> v_00;
  span<const_float> l;
  vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> *v;
  string fn;
  vector<float,_std::allocator<float>_> value;
  int local_24c;
  string local_248;
  undefined1 local_228 [24];
  memory_resource *local_210;
  float local_208;
  memory_resource *local_200;
  ParameterDictionary *local_1f8;
  ParameterDictionary *local_1f0;
  int local_1e8;
  memory_resource **local_1e0;
  ParsedParameter local_1d8;
  ParsedParameter local_108;
  memory_resource **local_38;
  undefined4 extraout_var;
  
  local_200 = alloc.memoryResource;
  local_1f8 = this;
  iVar7 = std::__cxx11::string::compare((char *)param);
  if ((iVar7 == 0) ||
     ((*(char *)(Options + 0xb) == '\x01' &&
      (iVar7 = std::__cxx11::string::compare((char *)param), iVar7 == 0)))) {
    local_24c = 3;
    uVar2 = (param->numbers).nStored;
    if (uVar2 != 0) {
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar2;
      if (0x5555555555555555 < SUB168(auVar5 * ZEXT816(0xaaaaaaaaaaaaaaab),0)) {
        ErrorExit<std::__cxx11::string_const&,int&>
                  (&param->loc,"Number of values provided for \"%s\" not a multiple of %d",
                   &param->name,&local_24c);
      }
      param->lookedUp = true;
      std::vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>::vector
                (__return_storage_ptr__,uVar2 / 3,(allocator_type *)&local_248);
      if (uVar2 < 3) {
        return __return_storage_ptr__;
      }
      uVar20 = 0;
      do {
        pdVar12 = (param->numbers).ptr;
        auVar5 = *(undefined1 (*) [16])(pdVar12 + (long)local_24c * uVar20);
        dVar1 = pdVar12[(long)local_24c * uVar20 + 2];
        local_208 = (float)dVar1;
        auVar4 = vcvtpd2ps_avx(auVar5);
        local_210 = (memory_resource *)vmovlps_avx(auVar4);
        cs = param->colorSpace;
        if (cs == (RGBColorSpace *)0x0) {
          cs = local_1f8->colorSpace;
        }
        if (spectrumType == General) {
          local_248._M_dataplus._M_p = (pointer)auVar5._0_8_;
          local_248._M_string_length = auVar5._8_8_;
          local_248.field_2._M_allocated_capacity = (size_type)dVar1;
          lVar18 = 8;
          psVar11 = &local_248;
          do {
            if (*(double *)((long)&local_248._M_dataplus._M_p + lVar18) <
                (double)(psVar11->_M_dataplus)._M_p) {
              psVar11 = (string *)((long)&local_248._M_dataplus._M_p + lVar18);
            }
            lVar18 = lVar18 + 8;
          } while (lVar18 != 0x18);
          if ((double)(psVar11->_M_dataplus)._M_p < 0.0) {
            ErrorExit(&param->loc,"RGB parameter \"%s\" has negative component value.");
          }
          iVar7 = (*local_200->_vptr_memory_resource[2])(local_200,0x28,8);
          this_00 = (RGBSpectrum *)CONCAT44(extraout_var_00,iVar7);
          RGBSpectrum::RGBSpectrum(this_00,cs,(RGB *)&local_210);
          uVar8 = 0x4000000000000;
        }
        else {
          if (spectrumType != Reflectance) {
            LogFatal<char_const(&)[38]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/paramdict.cpp"
                       ,0x186,"Check failed: %s",
                       (char (*) [38])"spectrumType == SpectrumType::General");
          }
          local_248._M_dataplus._M_p = (pointer)auVar5._0_8_;
          local_248._M_string_length = auVar5._8_8_;
          local_248.field_2._M_allocated_capacity = (size_type)dVar1;
          lVar18 = 8;
          psVar11 = &local_248;
          do {
            if (*(double *)((long)&local_248._M_dataplus._M_p + lVar18) <
                (double)(psVar11->_M_dataplus)._M_p) {
              psVar11 = (string *)((long)&local_248._M_dataplus._M_p + lVar18);
            }
            lVar18 = lVar18 + 8;
          } while (lVar18 != 0x18);
          if ((double)(psVar11->_M_dataplus)._M_p < 0.0) {
LAB_003afdc5:
            ErrorExit<std::__cxx11::string_const&>
                      (&param->loc,
                       "RGB reflectance parameter \"%s\" has parameter outside of [0,1].",
                       &param->name);
          }
          local_228._0_16_ = auVar5;
          local_228._16_8_ = dVar1;
          lVar18 = 8;
          pdVar12 = (double *)local_228;
          do {
            if (*pdVar12 < *(double *)(local_228 + lVar18)) {
              pdVar12 = (double *)(local_228 + lVar18);
            }
            lVar18 = lVar18 + 8;
          } while (lVar18 != 0x18);
          if (1.0 < *pdVar12) goto LAB_003afdc5;
          iVar7 = (*local_200->_vptr_memory_resource[2])(local_200,0x1c,4);
          this_00 = (RGBSpectrum *)CONCAT44(extraout_var,iVar7);
          RGBReflectanceSpectrum::RGBReflectanceSpectrum
                    ((RGBReflectanceSpectrum *)this_00,cs,(RGB *)&local_210);
          uVar8 = 0x5000000000000;
        }
        (__return_storage_ptr__->
        super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar20].
        super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
        .bits = (ulong)this_00 | uVar8;
        uVar20 = uVar20 + 1;
        if (uVar20 == uVar2 / 3) {
          return __return_storage_ptr__;
        }
      } while( true );
    }
  }
  else {
    iVar7 = std::__cxx11::string::compare((char *)param);
    if (iVar7 != 0) {
      iVar7 = std::__cxx11::string::compare((char *)param);
      if ((iVar7 != 0) || (uVar2 = (param->numbers).nStored, uVar2 == 0)) {
        iVar7 = std::__cxx11::string::compare((char *)param);
        if ((iVar7 != 0) || ((param->strings).nStored == 0)) {
          (__return_storage_ptr__->
          super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>)._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->
          super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>)._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->
          super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          return __return_storage_ptr__;
        }
        ParsedParameter::ParsedParameter(&local_108,param);
        local_38 = &local_200;
        sVar3 = (param->strings).nStored;
        if (sVar3 == 0) {
          ErrorExit<std::__cxx11::string_const&>
                    (&param->loc,"No values provided for \"%s\".",&param->name);
        }
        param->lookedUp = true;
        std::vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>::vector
                  (__return_storage_ptr__,sVar3,(allocator_type *)&local_248);
        lVar18 = 0;
        sVar13 = 0;
        do {
          psVar11 = (string *)((long)&(((param->strings).ptr)->_M_dataplus)._M_p + lVar18);
          GetNamedSpectrum((pbrt *)&local_210,psVar11);
          if (((ulong)local_210 & 0xffffffffffff) == 0) {
            alloc_00.memoryResource = *local_38;
            ResolveFilename(&local_248,psVar11);
            iVar9 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>_>
                    ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>_>
                            *)cachedSpectra_abi_cxx11_,&local_248);
            if (iVar9._M_node == (_Base_ptr)(cachedSpectra_abi_cxx11_ + 8)) {
              PiecewiseLinearSpectrum::Read
                        ((PiecewiseLinearSpectrum *)local_228,&local_248,alloc_00);
              if (local_228[8] == '\0') {
                pmVar19 = (memory_resource *)0x0;
              }
              else {
                pmVar10 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>_>
                          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>_>
                                        *)cachedSpectra_abi_cxx11_,&local_248);
                (pmVar10->
                super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
                ).bits = local_228._0_8_;
                pmVar19 = (memory_resource *)local_228._0_8_;
                if (local_228[8] == '\0') {
                  LogFatal<char_const(&)[4]>
                            (Fatal,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                             ,0xea,"Check failed: %s",(char (*) [4])0x3089585);
                }
              }
              if (local_228[8] == '\x01') {
                local_228[8] = 0;
              }
            }
            else {
              pmVar10 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>_>
                                      *)cachedSpectra_abi_cxx11_,&local_248);
              pmVar19 = (memory_resource *)
                        (pmVar10->
                        super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
                        ).bits;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248._M_dataplus._M_p != &local_248.field_2) {
              operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1
                             );
            }
            local_210 = pmVar19;
            if (((ulong)pmVar19 & 0xffffffffffff) == 0) {
              ErrorExit<std::__cxx11::string_const&>
                        (&local_108.loc,"%s: unable to read valid spectrum file",psVar11);
            }
          }
          (__return_storage_ptr__->
          super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>)._M_impl.
          super__Vector_impl_data._M_start[sVar13].
          super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
          .bits = (uintptr_t)local_210;
          sVar13 = sVar13 + 1;
          lVar18 = lVar18 + 0x20;
        } while (sVar3 != sVar13);
        local_108.bools.nStored = 0;
        (*(local_108.bools.alloc.memoryResource)->_vptr_memory_resource[3])
                  (local_108.bools.alloc.memoryResource,local_108.bools.ptr,local_108.bools.nAlloc,1
                  );
        pstd::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_108.strings);
        local_108.numbers.nStored = 0;
        (*(local_108.numbers.alloc.memoryResource)->_vptr_memory_resource[3])
                  (local_108.numbers.alloc.memoryResource,local_108.numbers.ptr,
                   local_108.numbers.nAlloc << 3,8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108.name._M_dataplus._M_p != &local_108.name.field_2) {
          operator_delete(local_108.name._M_dataplus._M_p,
                          local_108.name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108.type._M_dataplus._M_p == &local_108.type.field_2) {
          return __return_storage_ptr__;
        }
LAB_003afd81:
        operator_delete(local_108.type._M_dataplus._M_p,
                        local_108.type.field_2._M_allocated_capacity + 1);
        return __return_storage_ptr__;
      }
      if ((uVar2 & 1) == 0) {
        local_1f0 = local_1f8;
        local_1e8 = (int)(uVar2 >> 1);
        local_1e0 = &local_200;
        ParsedParameter::ParsedParameter(&local_1d8,param);
        local_24c = (int)uVar2;
        uVar2 = (param->numbers).nStored;
        if (uVar2 == 0) {
          ErrorExit<std::__cxx11::string_const&>
                    (&param->loc,"No values provided for \"%s\".",&param->name);
        }
        uVar20 = (ulong)local_24c;
        if (uVar2 % uVar20 != 0) {
          ErrorExit<std::__cxx11::string_const&,int&>
                    (&param->loc,"Number of values provided for \"%s\" not a multiple of %d",
                     &param->name,&local_24c);
        }
        param->lookedUp = true;
        local_1f8 = (ParameterDictionary *)(uVar2 / uVar20);
        std::vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>::vector
                  (__return_storage_ptr__,(size_type)(uVar2 / uVar20),(allocator_type *)&local_248);
        if (uVar20 <= uVar2) {
          lVar18 = 0;
          pPVar14 = (ParameterDictionary *)0x0;
          do {
            iVar7 = local_24c;
            pdVar12 = (param->numbers).ptr;
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)&local_248,(long)local_1e8,
                       (allocator_type *)local_228);
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)local_228,(long)local_1e8,
                       (allocator_type *)&local_210);
            ppmVar6 = local_1e0;
            if (0 < (long)local_1e8) {
              lVar21 = iVar7 * lVar18;
              FVar15 = -NAN;
              lVar16 = 0;
              lVar17 = 0;
              do {
                if ((lVar17 != 0) &&
                   (*(double *)((long)pdVar12 + lVar17 * 4 + lVar21) <=
                    (double)*(float *)(local_248._M_dataplus._M_p + lVar17 + -4))) {
                  local_210 = (memory_resource *)CONCAT44(local_210._4_4_,FVar15);
                  ErrorExit<int,float&,double_const&>
                            (&local_1d8.loc,
                             "Spectrum description invalid: at %d\'th entry, wavelengths aren\'t increasing: %f >= %f."
                             ,(int *)&local_210,(float *)(local_248._M_dataplus._M_p + lVar17 + -4),
                             (double *)((long)pdVar12 + (lVar21 - lVar16)));
                }
                *(float *)(local_248._M_dataplus._M_p + lVar17) =
                     (float)*(double *)((long)pdVar12 + lVar17 * 4 + lVar21);
                *(float *)((long)(_func_int ***)local_228._0_8_ + lVar17) =
                     (float)*(double *)((long)pdVar12 + lVar17 * 4 + lVar21 + 8);
                lVar17 = lVar17 + 4;
                FVar15 = (Float)((int)FVar15 + 1);
                lVar16 = lVar16 + -0x10;
              } while ((long)local_1e8 * 4 != lVar17);
            }
            iVar7 = (*(*local_1e0)->_vptr_memory_resource[2])(*local_1e0,0x40,8);
            l.n = (long)(local_248._M_string_length - (long)local_248._M_dataplus._M_p) >> 2;
            v_00.n = (long)(local_228._8_8_ - local_228._0_8_) >> 2;
            v_00.ptr = (float *)local_228._0_8_;
            l.ptr = (float *)local_248._M_dataplus._M_p;
            PiecewiseLinearSpectrum::PiecewiseLinearSpectrum
                      ((PiecewiseLinearSpectrum *)CONCAT44(extraout_var_02,iVar7),l,v_00,*ppmVar6);
            if ((memory_resource *)local_228._0_8_ != (memory_resource *)0x0) {
              operator_delete((void *)local_228._0_8_,local_228._16_8_ - local_228._0_8_);
            }
            if (local_248._M_dataplus._M_p != (pointer)0x0) {
              operator_delete(local_248._M_dataplus._M_p,
                              local_248.field_2._M_allocated_capacity -
                              (long)local_248._M_dataplus._M_p);
            }
            (__return_storage_ptr__->
            super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>)._M_impl
            .super__Vector_impl_data._M_start[(long)pPVar14].
            super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
            .bits = CONCAT44(extraout_var_02,iVar7) | 0x3000000000000;
            pPVar14 = (ParameterDictionary *)((long)&(pPVar14->params).alloc.memoryResource + 1);
            lVar18 = lVar18 + 8;
          } while (pPVar14 < local_1f8);
        }
        local_1d8.bools.nStored = 0;
        (*(local_1d8.bools.alloc.memoryResource)->_vptr_memory_resource[3])
                  (local_1d8.bools.alloc.memoryResource,local_1d8.bools.ptr,local_1d8.bools.nAlloc,1
                  );
        pstd::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_1d8.strings);
        local_1d8.numbers.nStored = 0;
        (*(local_1d8.numbers.alloc.memoryResource)->_vptr_memory_resource[3])
                  (local_1d8.numbers.alloc.memoryResource,local_1d8.numbers.ptr,
                   local_1d8.numbers.nAlloc << 3,8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8.name._M_dataplus._M_p != &local_1d8.name.field_2) {
          operator_delete(local_1d8.name._M_dataplus._M_p,
                          local_1d8.name.field_2._M_allocated_capacity + 1);
        }
        local_108.type.field_2._M_allocated_capacity = local_1d8.type.field_2._M_allocated_capacity;
        local_108.type._M_dataplus._M_p = local_1d8.type._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8.type._M_dataplus._M_p == &local_1d8.type.field_2) {
          return __return_storage_ptr__;
        }
        goto LAB_003afd81;
      }
      fmt = "Found odd number of values for \"%s\"";
      goto LAB_003afe39;
    }
    sVar3 = (param->numbers).nStored;
    if (sVar3 != 0) {
      param->lookedUp = true;
      std::vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>::vector
                (__return_storage_ptr__,sVar3,(allocator_type *)&local_248);
      sVar13 = 0;
      do {
        pdVar12 = (param->numbers).ptr;
        iVar7 = (*local_200->_vptr_memory_resource[2])(local_200,8,4);
        BlackbodySpectrum::BlackbodySpectrum
                  ((BlackbodySpectrum *)CONCAT44(extraout_var_01,iVar7),(float)pdVar12[sVar13]);
        (__return_storage_ptr__->
        super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>)._M_impl.
        super__Vector_impl_data._M_start[sVar13].
        super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
        .bits = CONCAT44(extraout_var_01,iVar7) | 0x6000000000000;
        sVar13 = sVar13 + 1;
      } while (sVar3 != sVar13);
      return __return_storage_ptr__;
    }
  }
  fmt = "No values provided for \"%s\".";
LAB_003afe39:
  ErrorExit<std::__cxx11::string_const&>(&param->loc,fmt,&param->name);
}

Assistant:

std::vector<SpectrumHandle> ParameterDictionary::extractSpectrumArray(
    const ParsedParameter &param, SpectrumType spectrumType, Allocator alloc) const {
    if (param.type == "rgb" || (Options->upgrade && param.type == "color"))
        return returnArray<SpectrumHandle>(
            param.numbers, param, 3,
            [this, spectrumType, &alloc, &param](const double *v,
                                                 const FileLoc *loc) -> SpectrumHandle {
                RGB rgb(v[0], v[1], v[2]);
                const RGBColorSpace &cs =
                    param.colorSpace ? *param.colorSpace : *colorSpace;
                if (spectrumType == SpectrumType::Reflectance) {
                    if (std::min({v[0], v[1], v[2]}) < 0 ||
                        std::max({v[0], v[1], v[2]}) > 1)
                        ErrorExit(&param.loc,
                                  "RGB reflectance parameter \"%s\" has "
                                  "parameter outside of [0,1].",
                                  param.name);
                    return alloc.new_object<RGBReflectanceSpectrum>(cs, rgb);
                } else {
                    CHECK(spectrumType == SpectrumType::General);
                    if (std::min({v[0], v[1], v[2]}) < 0)
                        ErrorExit(&param.loc,
                                  "RGB parameter \"%s\" has negative component value.");
                    return alloc.new_object<RGBSpectrum>(cs, rgb);
                }
            });
    else if (param.type == "blackbody")
        return returnArray<SpectrumHandle>(
            param.numbers, param, 1,
            [this, &alloc](const double *v, const FileLoc *loc) -> SpectrumHandle {
                return alloc.new_object<BlackbodySpectrum>(v[0]);
            });
    else if (param.type == "spectrum" && !param.numbers.empty()) {
        if (param.numbers.size() % 2 != 0)
            ErrorExit(&param.loc, "Found odd number of values for \"%s\"", param.name);

        int nSamples = param.numbers.size() / 2;
        return returnArray<SpectrumHandle>(
            param.numbers, param, param.numbers.size(),
            [this, nSamples, &alloc, param](const double *v,
                                            const FileLoc *Loc) -> SpectrumHandle {
                std::vector<Float> lambda(nSamples), value(nSamples);
                for (int i = 0; i < nSamples; ++i) {
                    if (i > 0 && v[2 * i] <= lambda[i - 1])
                        ErrorExit(&param.loc,
                                  "Spectrum description invalid: at %d'th entry, "
                                  "wavelengths aren't increasing: %f >= %f.",
                                  i - 1, lambda[i - 1], v[2 * i]);
                    lambda[i] = v[2 * i];
                    value[i] = v[2 * i + 1];
                }
                return alloc.new_object<PiecewiseLinearSpectrum>(lambda, value, alloc);
            });
    } else if (param.type == "spectrum" && !param.strings.empty())
        return returnArray<SpectrumHandle>(
            param.strings, param, 1,
            [param, &alloc](const std::string *s, const FileLoc *loc) -> SpectrumHandle {
                SpectrumHandle spd = GetNamedSpectrum(*s);
                if (spd)
                    return spd;

                spd = readSpectrumFromFile(*s, alloc);
                if (!spd)
                    ErrorExit(&param.loc, "%s: unable to read valid spectrum file", *s);
                return spd;
            });

    return {};
}